

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall QWidgetTextControl::setDocument(QWidgetTextControl *this,QTextDocument *document)

{
  long lVar1;
  QWidgetTextControlPrivate *pQVar2;
  QPaintDevice *pQVar3;
  QObject *pQVar4;
  QTextDocument *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QWidgetTextControlPrivate *d;
  QTextDocument *in_stack_000000e0;
  QString *in_stack_000000e8;
  TextFormat in_stack_000000f4;
  QWidgetTextControlPrivate *in_stack_000000f8;
  QObject *in_stack_ffffffffffffffa8;
  QObject *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QWidgetTextControl *)0x7135cf);
  if (pQVar2->doc != in_RSI) {
    QObject::disconnect(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(char *)0x713600);
    QTextDocument::documentLayout();
    QObject::disconnect(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(char *)0x71361f);
    pQVar3 = (QPaintDevice *)QTextDocument::documentLayout();
    QAbstractTextDocumentLayout::setPaintDevice(pQVar3);
    pQVar4 = QObject::parent((QObject *)0x713647);
    if ((pQVar4 == in_RDI) && (pQVar2->doc != (QTextDocument *)0x0)) {
      (**(code **)(*(long *)pQVar2->doc + 0x20))();
    }
    pQVar2->doc = (QTextDocument *)0x0;
    QString::QString((QString *)0x713693);
    QWidgetTextControlPrivate::setContent
              (in_stack_000000f8,in_stack_000000f4,in_stack_000000e8,in_stack_000000e0);
    QString::~QString((QString *)0x7136b6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControl::setDocument(QTextDocument *document)
{
    Q_D(QWidgetTextControl);
    if (d->doc == document)
        return;

    d->doc->disconnect(this);
    d->doc->documentLayout()->disconnect(this);
    d->doc->documentLayout()->setPaintDevice(nullptr);

    if (d->doc->parent() == this)
        delete d->doc;

    d->doc = nullptr;
    d->setContent(Qt::RichText, QString(), document);
}